

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rasterization_line_state
          (Impl *this,Value *state,VkPipelineRasterizationLineStateCreateInfoKHR **out_info)

{
  VkPipelineRasterizationLineStateCreateInfoKHR *pVVar1;
  Type pGVar2;
  
  pVVar1 = (VkPipelineRasterizationLineStateCreateInfoKHR *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar1 != (VkPipelineRasterizationLineStateCreateInfoKHR *)0x0) {
    pVVar1->lineRasterizationMode = VK_LINE_RASTERIZATION_MODE_DEFAULT;
    pVVar1->stippledLineEnable = 0;
    pVVar1->lineStippleFactor = 0;
    pVVar1->lineStipplePattern = 0;
    *(undefined2 *)&pVVar1->field_0x1e = 0;
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
  }
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"lineRasterizationMode");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->lineRasterizationMode = (pGVar2->data_).s.length;
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"stippledLineEnable");
    if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar1->stippledLineEnable = (pGVar2->data_).s.length;
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"lineStippleFactor");
      if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar1->lineStippleFactor = (pGVar2->data_).s.length;
        pGVar2 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)state,"lineStipplePattern");
        if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000)
            != (undefined1  [16])0x0) {
          pVVar1->lineStipplePattern = *(uint16_t *)&pGVar2->data_;
          *out_info = pVVar1;
          return true;
        }
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_rasterization_line_state(const Value &state,
                                                         VkPipelineRasterizationLineStateCreateInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineRasterizationLineStateCreateInfoKHR>();

	info->lineRasterizationMode = static_cast<VkLineRasterizationModeEXT>(state["lineRasterizationMode"].GetUint());
	info->stippledLineEnable = state["stippledLineEnable"].GetUint();
	info->lineStippleFactor = state["lineStippleFactor"].GetUint();
	info->lineStipplePattern = state["lineStipplePattern"].GetUint();

	*out_info = info;
	return true;
}